

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O2

void __thiscall wasm::FunctionValidator::visitTry(FunctionValidator *this,Try *curr)

{
  ExpressionList *pEVar1;
  Type right;
  Type left;
  ArenaVector<wasm::Expression_*> *pAVar2;
  ulong uVar3;
  Expression *expr;
  Expression **ppEVar4;
  Name *pNVar5;
  Tag *pTVar6;
  ostream *poVar7;
  long lVar8;
  ostream *poVar9;
  char *pcVar10;
  Try *pTVar11;
  char *pcVar12;
  uint uVar13;
  ExpressionList *__range2;
  ulong index;
  bool bVar14;
  Name name;
  Name name_00;
  Name name_01;
  Name name_02;
  Name name_03;
  Name name_04;
  Name name_05;
  undefined1 local_70 [8];
  Iterator __begin2;
  pointer local_58;
  
  shouldBeTrue<wasm::Try*>
            (this,SUB41(((((this->
                           super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                           ).
                           super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                           .
                           super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                          .currModule)->features).features & 0x40) >> 6,0),curr,
             "try requires exception-handling [--enable-exception-handling]");
  pcVar12 = (curr->name).super_IString.str._M_str;
  if (pcVar12 != (char *)0x0) {
    name.super_IString.str._M_str = pcVar12;
    name.super_IString.str._M_len = (curr->name).super_IString.str._M_len;
    noteLabelName(this,name);
  }
  right.id = (curr->super_SpecificExpression<(wasm::Expression::Id)49>).super_Expression.type.id;
  pEVar1 = &curr->catchBodies;
  left.id = (curr->body->type).id;
  local_70 = (undefined1  [8])pEVar1;
  if (right.id == 1) {
    shouldBeEqual<wasm::Try*,wasm::Type>
              (this,left,(Type)0x1,curr,"unreachable try-catch must have unreachable try body");
    __begin2.parent = (ArenaVector<wasm::Expression_*> *)0x0;
    pAVar2 = (ArenaVector<wasm::Expression_*> *)
             (curr->catchBodies).
             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements
    ;
    while ((__begin2.parent != pAVar2 || (local_70 != (undefined1  [8])pEVar1))) {
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                operator*((Iterator *)local_70);
      shouldBeEqual<wasm::Try*,wasm::Type>
                (this,(Type)((*ppEVar4)->type).id,(Type)0x1,curr,
                 "unreachable try-catch must have unreachable catch body");
      __begin2.parent =
           (ArenaVector<wasm::Expression_*> *)
           ((long)&((__begin2.parent)->
                   super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).data
           + 1);
    }
  }
  else {
    shouldBeSubType(this,left,right,curr->body,"try\'s type does not match try body\'s type");
    __begin2.parent = (ArenaVector<wasm::Expression_*> *)0x0;
    pAVar2 = (ArenaVector<wasm::Expression_*> *)
             (curr->catchBodies).
             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements
    ;
    while ((__begin2.parent != pAVar2 || (local_70 != (undefined1  [8])pEVar1))) {
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                operator*((Iterator *)local_70);
      shouldBeSubType(this,(Type)((*ppEVar4)->type).id,
                      (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)49>).
                            super_Expression.type.id,*ppEVar4,
                      "try\'s type does not match catch\'s body type");
      __begin2.parent =
           (ArenaVector<wasm::Expression_*> *)
           ((long)&((__begin2.parent)->
                   super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).data
           + 1);
    }
  }
  shouldBeTrue<wasm::Try*>
            (this,(curr->catchBodies).
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                  usedElements -
                  (curr->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
                  usedElements < 2,curr,"the number of catch blocks and tags do not match");
  uVar13 = 0;
  if ((curr->catchBodies).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
      .usedElements == 0) {
    bVar14 = false;
  }
  else {
    bVar14 = (curr->delegateTarget).super_IString.str._M_str != (char *)0x0;
  }
  shouldBeFalse<wasm::Try*>
            (this,bVar14,curr,"try cannot have both catch and delegate at the same time");
  do {
    index = (ulong)uVar13;
    uVar3 = (curr->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
            usedElements;
    if (uVar3 <= index) {
      if ((curr->catchBodies).
          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements -
          uVar3 == 1) {
        ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                            (&(curr->catchBodies).
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            );
        EHUtils::findPops((SmallVector<wasm::Pop_*,_1UL> *)local_70,*ppEVar4);
        shouldBeTrue<wasm::Try*>
                  (this,(undefined1 *)
                        ((long)&((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                  *)local_70)->data + ((long)((long)local_58 - __begin2.index) >> 3)
                        ) == (undefined1 *)0x0,curr,"catch_all\'s body should not have pops");
        std::_Vector_base<wasm::Pop_*,_std::allocator<wasm::Pop_*>_>::~_Vector_base
                  ((_Vector_base<wasm::Pop_*,_std::allocator<wasm::Pop_*>_> *)&__begin2.index);
      }
      pcVar12 = (curr->delegateTarget).super_IString.str._M_str;
      if (pcVar12 != (char *)0x0) {
        name_00.super_IString.str._M_str = pcVar12;
        name_00.super_IString.str._M_len = (curr->delegateTarget).super_IString.str._M_len;
        noteDelegate(this,name_00,(Expression *)curr);
      }
      std::
      _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::_M_erase(&(this->rethrowTargetNames)._M_h,&curr->name);
      return;
    }
    pNVar5 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                       (&(curr->catchTags).
                         super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,index);
    poVar9 = (ostream *)(pNVar5->super_IString).str._M_len;
    pcVar12 = (pNVar5->super_IString).str._M_str;
    pTVar6 = Module::getTagOrNull
                       ((this->
                        super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                        ).
                        super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                        .
                        super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                        .currModule,(Name)(pNVar5->super_IString).str);
    pcVar10 = "";
    bVar14 = shouldBeTrue<wasm::Try*>(this,pTVar6 != (Tag *)0x0,curr,"");
    if (!bVar14) {
      poVar7 = getStream(this);
      poVar7 = std::operator<<(poVar7,"tag name is invalid: ");
      name_01.super_IString.str._M_str = pcVar10;
      name_01.super_IString.str._M_len = (size_t)pcVar12;
      poVar7 = wasm::operator<<((wasm *)poVar7,poVar9,name_01);
      std::operator<<(poVar7,"\n");
    }
    ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                        (&(curr->catchBodies).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                         ,index);
    expr = *ppEVar4;
    EHUtils::findPops((SmallVector<wasm::Pop_*,_1UL> *)local_70,expr);
    lVar8 = (long)((long)local_58 - __begin2.index) >> 3;
    if ((pTVar6->sig).params.id == 0) {
      pcVar10 = "";
      bVar14 = shouldBeTrue<wasm::Try*>
                         (this,(undefined1 *)
                               ((long)&((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                         *)local_70)->data + lVar8) == (undefined1 *)0x0,curr,"");
      if (!bVar14) {
        poVar7 = getStream(this);
        poVar7 = std::operator<<(poVar7,"catch\'s tag (");
        name_04.super_IString.str._M_str = pcVar10;
        name_04.super_IString.str._M_len = (size_t)pcVar12;
        poVar9 = wasm::operator<<((wasm *)poVar7,poVar9,name_04);
        pcVar12 = ") doesn\'t have any params, but there are pops";
        goto LAB_00a422ea;
      }
    }
    else {
      pcVar10 = "";
      bVar14 = shouldBeTrue<wasm::Try*>
                         (this,(undefined1 *)
                               ((long)&((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                         *)local_70)->data + lVar8) == (undefined1 *)0x1,curr,"");
      if (bVar14) {
        pTVar11 = curr;
        bVar14 = shouldBeSubType(this,(Type)(pTVar6->sig).params.id,
                                 (Type)((__begin2.parent)->
                                       super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                       ).usedElements,(Expression *)curr,"");
        if (!bVar14) {
          poVar7 = getStream(this);
          poVar7 = std::operator<<(poVar7,"catch\'s tag (");
          name_02.super_IString.str._M_str = (char *)pTVar11;
          name_02.super_IString.str._M_len = (size_t)pcVar12;
          poVar7 = wasm::operator<<((wasm *)poVar7,poVar9,name_02);
          std::operator<<(poVar7,")\'s pop doesn\'t have the same type as the tag\'s params");
        }
        bVar14 = EHUtils::containsValidDanglingPop(expr);
        pcVar10 = "";
        bVar14 = shouldBeTrue<wasm::Try*>(this,bVar14,curr,"");
        if (!bVar14) {
          poVar7 = getStream(this);
          poVar7 = std::operator<<(poVar7,"catch\'s body (");
          name_03.super_IString.str._M_str = pcVar10;
          name_03.super_IString.str._M_len = (size_t)pcVar12;
          poVar9 = wasm::operator<<((wasm *)poVar7,poVar9,name_03);
          std::operator<<(poVar9,")\'s pop\'s location is not valid");
        }
      }
      else {
        poVar7 = getStream(this);
        poVar7 = std::operator<<(poVar7,"catch\'s tag (");
        name_05.super_IString.str._M_str = pcVar10;
        name_05.super_IString.str._M_len = (size_t)pcVar12;
        poVar9 = wasm::operator<<((wasm *)poVar7,poVar9,name_05);
        pcVar12 = ") has params, so there should be a single pop within the catch body";
LAB_00a422ea:
        std::operator<<(poVar9,pcVar12);
      }
    }
    std::_Vector_base<wasm::Pop_*,_std::allocator<wasm::Pop_*>_>::~_Vector_base
              ((_Vector_base<wasm::Pop_*,_std::allocator<wasm::Pop_*>_> *)&__begin2.index);
    uVar13 = uVar13 + 1;
  } while( true );
}

Assistant:

void FunctionValidator::visitTry(Try* curr) {
  shouldBeTrue(getModule()->features.hasExceptionHandling(),
               curr,
               "try requires exception-handling [--enable-exception-handling]");
  if (curr->name.is()) {
    noteLabelName(curr->name);
  }
  if (curr->type != Type::unreachable) {
    shouldBeSubType(curr->body->type,
                    curr->type,
                    curr->body,
                    "try's type does not match try body's type");
    for (auto catchBody : curr->catchBodies) {
      shouldBeSubType(catchBody->type,
                      curr->type,
                      catchBody,
                      "try's type does not match catch's body type");
    }
  } else {
    shouldBeEqual(curr->body->type,
                  Type(Type::unreachable),
                  curr,
                  "unreachable try-catch must have unreachable try body");
    for (auto catchBody : curr->catchBodies) {
      shouldBeEqual(catchBody->type,
                    Type(Type::unreachable),
                    curr,
                    "unreachable try-catch must have unreachable catch body");
    }
  }
  shouldBeTrue(curr->catchBodies.size() - curr->catchTags.size() <= 1,
               curr,
               "the number of catch blocks and tags do not match");

  shouldBeFalse(curr->isCatch() && curr->isDelegate(),
                curr,
                "try cannot have both catch and delegate at the same time");

  for (Index i = 0; i < curr->catchTags.size(); i++) {
    Name tagName = curr->catchTags[i];
    auto* tag = getModule()->getTagOrNull(tagName);
    if (!shouldBeTrue(tag != nullptr, curr, "")) {
      getStream() << "tag name is invalid: " << tagName << "\n";
    }

    auto* catchBody = curr->catchBodies[i];
    auto pops = EHUtils::findPops(catchBody);
    if (tag->sig.params == Type::none) {
      if (!shouldBeTrue(pops.empty(), curr, "")) {
        getStream() << "catch's tag (" << tagName
                    << ") doesn't have any params, but there are pops";
      }
    } else {
      if (shouldBeTrue(pops.size() == 1, curr, "")) {
        auto* pop = *pops.begin();
        if (!shouldBeSubType(tag->sig.params, pop->type, curr, "")) {
          getStream()
            << "catch's tag (" << tagName
            << ")'s pop doesn't have the same type as the tag's params";
        }
        if (!shouldBeTrue(
              EHUtils::containsValidDanglingPop(catchBody), curr, "")) {
          getStream() << "catch's body (" << tagName
                      << ")'s pop's location is not valid";
        }
      } else {
        getStream() << "catch's tag (" << tagName
                    << ") has params, so there should be a single pop within "
                       "the catch body";
      }
    }
  }

  if (curr->hasCatchAll()) {
    auto* catchAllBody = curr->catchBodies.back();
    shouldBeTrue(EHUtils::findPops(catchAllBody).empty(),
                 curr,
                 "catch_all's body should not have pops");
  }

  if (curr->isDelegate()) {
    noteDelegate(curr->delegateTarget, curr);
  }

  rethrowTargetNames.erase(curr->name);
}